

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<8,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  int row_3;
  int row_2;
  float *pfVar10;
  int col_1;
  int col;
  undefined4 uVar11;
  float minorMatrices [4] [9];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158 [12];
  float local_128 [12];
  float local_f8 [12];
  float local_c8 [12];
  undefined8 local_98;
  float local_90 [4];
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  Type in0;
  
  pfVar6 = local_158;
  puVar1 = &local_198;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        uVar11 = 0x3f800000;
        if (lVar3 != lVar9) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar9) = uVar11;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x40);
      lVar7 = lVar7 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar3 = lVar3 + 0x10;
    } while (lVar7 != 4);
    local_198 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_190 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_188 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_180 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_178 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_170 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_168 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_160 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    local_168 = 0;
    uStack_160 = 0;
    local_178 = 0;
    uStack_170 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar7 * 4) = *(undefined4 *)((long)puVar4 + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x10);
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  pfVar8 = &local_74;
  local_98 = (Vec4 *)CONCAT44((float)uStack_180,local_188._4_4_);
  local_90[1] = local_178._4_4_;
  local_90[0] = uStack_180._4_4_;
  local_90[2] = (float)uStack_170;
  local_90[3] = uStack_170._4_4_;
  local_80 = local_168._4_4_;
  local_7c = (float)uStack_160;
  local_78 = uStack_160._4_4_;
  local_74 = local_198._4_4_;
  local_70 = (float)uStack_190;
  local_6c = uStack_190._4_4_;
  local_68 = local_178._4_4_;
  local_64 = (float)uStack_170;
  local_60 = uStack_170._4_4_;
  local_5c = local_168._4_4_;
  local_58 = (float)uStack_160;
  local_54 = uStack_160._4_4_;
  pfVar5 = &local_50;
  local_50 = local_198._4_4_;
  local_4c = (float)uStack_190;
  local_48 = uStack_190._4_4_;
  local_44 = local_188._4_4_;
  in0.m_data.m_data[0].m_data[0] = (float)uStack_180;
  in0.m_data.m_data[0].m_data[1] = uStack_180._4_4_;
  in0.m_data.m_data[0].m_data[2] = local_168._4_4_;
  in0.m_data.m_data[0].m_data[3] = (float)uStack_160;
  in0.m_data.m_data[1].m_data[0] = uStack_160._4_4_;
  pfVar2 = in0.m_data.m_data[1].m_data + 1;
  in0.m_data.m_data[1].m_data[1] = local_198._4_4_;
  in0.m_data.m_data[1].m_data[2] = (float)uStack_190;
  in0.m_data.m_data[1].m_data[3] = uStack_190._4_4_;
  in0.m_data.m_data[2].m_data[0] = local_188._4_4_;
  in0.m_data.m_data[2].m_data[1] = (float)uStack_180;
  in0.m_data.m_data[2].m_data[2] = uStack_180._4_4_;
  in0.m_data.m_data[2].m_data[3] = local_178._4_4_;
  in0.m_data.m_data[3].m_data[0] = (float)uStack_170;
  in0.m_data.m_data[3].m_data[1] = uStack_170._4_4_;
  local_158[4] = 0.0;
  local_158[5] = 0.0;
  local_158[6] = 0.0;
  local_158[7] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  local_158[8] = 0.0;
  puVar1 = &local_98;
  lVar3 = 0;
  do {
    lVar7 = 0;
    puVar4 = pfVar6;
    do {
      *puVar4 = *(undefined4 *)((long)puVar1 + lVar7 * 4);
      lVar7 = lVar7 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar7 != 3);
    lVar3 = lVar3 + 1;
    pfVar6 = pfVar6 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 0xc);
  } while (lVar3 != 3);
  pfVar6 = local_c8;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_c8[8] = 0.0;
  lVar3 = 0;
  do {
    lVar7 = 0;
    pfVar10 = pfVar6;
    do {
      *pfVar10 = pfVar8[lVar7];
      lVar7 = lVar7 + 1;
      pfVar10 = pfVar10 + 3;
    } while (lVar7 != 3);
    lVar3 = lVar3 + 1;
    pfVar6 = pfVar6 + 1;
    pfVar8 = pfVar8 + 3;
  } while (lVar3 != 3);
  pfVar6 = local_f8;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[8] = 0.0;
  lVar3 = 0;
  do {
    lVar7 = 0;
    pfVar8 = pfVar6;
    do {
      *pfVar8 = pfVar5[lVar7];
      lVar7 = lVar7 + 1;
      pfVar8 = pfVar8 + 3;
    } while (lVar7 != 3);
    lVar3 = lVar3 + 1;
    pfVar6 = pfVar6 + 1;
    pfVar5 = pfVar5 + 3;
  } while (lVar3 != 3);
  pfVar6 = local_128;
  local_128[4] = 0.0;
  local_128[5] = 0.0;
  local_128[6] = 0.0;
  local_128[7] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  local_128[3] = 0.0;
  local_128[8] = 0.0;
  lVar3 = 0;
  do {
    lVar7 = 0;
    pfVar8 = pfVar6;
    do {
      *pfVar8 = pfVar2[lVar7];
      lVar7 = lVar7 + 1;
      pfVar8 = pfVar8 + 3;
    } while (lVar7 != 3);
    lVar3 = lVar3 + 1;
    pfVar6 = pfVar6 + 1;
    pfVar2 = pfVar2 + 3;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    local_158[lVar3] =
         (((float)local_198 *
           ((((local_158[6] * local_158[1] * local_158[5] +
              local_158[0] * local_158[4] * local_158[8] +
              local_158[3] * local_158[7] * local_158[2]) -
             local_158[7] * local_158[0] * local_158[5]) -
            local_158[1] * local_158[3] * local_158[8]) - local_158[4] * local_158[6] * local_158[2]
           ) - ((((local_c8[6] * local_c8[1] * local_c8[5] +
                  local_c8[0] * local_c8[4] * local_c8[8] + local_c8[3] * local_c8[7] * local_c8[2])
                 - local_c8[7] * local_c8[0] * local_c8[5]) -
                local_c8[1] * local_c8[3] * local_c8[8]) - local_c8[4] * local_c8[6] * local_c8[2])
               * (float)local_188) +
         (float)local_178 *
         ((((local_f8[6] * local_f8[1] * local_f8[5] +
            local_f8[0] * local_f8[4] * local_f8[8] + local_f8[3] * local_f8[7] * local_f8[2]) -
           local_f8[7] * local_f8[0] * local_f8[5]) - local_f8[1] * local_f8[3] * local_f8[8]) -
         local_f8[4] * local_f8[6] * local_f8[2])) -
         (float)local_168 *
         ((((local_128[6] * local_128[1] * local_128[5] +
            local_128[0] * local_128[4] * local_128[8] + local_128[3] * local_128[7] * local_128[2])
           - local_128[7] * local_128[0] * local_128[5]) -
          local_128[1] * local_128[3] * local_128[8]) - local_128[4] * local_128[6] * local_128[2]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_98 = &evalCtx->color;
  local_90[0] = 0.0;
  local_90[1] = 1.4013e-45;
  local_90[2] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_98 + lVar3 * 4)] =
         *(float *)((long)&uStack_160 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = Vec3(determinant(in0));
	}